

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 __s;
  char cVar4;
  bool bVar5;
  char *pcVar6;
  char_t *pcVar7;
  char_t *pcVar8;
  xml_node_struct *pxVar9;
  xpath_ast_node *pxVar10;
  undefined8 *puVar11;
  size_t sVar12;
  xpath_memory_block *pxVar13;
  undefined7 extraout_var;
  xpath_node *pxVar14;
  undefined1 *puVar15;
  xpath_string *pxVar16;
  xpath_string *extraout_RAX;
  ulong uVar17;
  size_t sVar18;
  xpath_string *pxVar19;
  xpath_memory_block *pxVar20;
  byte bVar21;
  xml_attribute xVar22;
  char *pcVar23;
  size_t *psVar24;
  bool *pbVar25;
  xpath_string *pxVar26;
  xpath_string *pxVar27;
  long lVar28;
  char *pcVar29;
  long lVar30;
  undefined1 *puVar31;
  long lVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  xpath_node xVar36;
  double v;
  xpath_allocator_capture local_d8;
  undefined1 local_b0 [16];
  xpath_node *local_a0;
  xml_node_struct *local_90;
  xpath_memory_block *local_88;
  undefined1 local_80 [16];
  ulong local_70;
  undefined1 local_68 [16];
  size_t local_58;
  undefined8 *local_48;
  xpath_stack local_40;
  
LAB_0015fa24:
  switch(this->_type) {
  case '\x12':
    goto switchD_0015fa3c_caseD_12;
  default:
    cVar4 = this->_rettype;
    goto LAB_00160124;
  case '\x14':
    cVar4 = this->_rettype;
    if (cVar4 == '\x03') {
      if (((this->_data).variable)->_type == xpath_type_string) {
        pxVar16 = *(xpath_string **)((this->_data).variable + 1);
      }
      else {
        pxVar16 = (xpath_string *)0x0;
      }
      pxVar19 = (xpath_string *)0x16ad89;
      if (pxVar16 != (xpath_string *)0x0) {
        pxVar19 = pxVar16;
      }
      goto LAB_0016059f;
    }
LAB_00160124:
    if (cVar4 != '\x01') {
      if (cVar4 == '\x02') {
        dVar33 = eval_number(this,c,stack);
        pxVar16 = convert_number_to_string(__return_storage_ptr__,dVar33,stack->result);
        return pxVar16;
      }
      if (cVar4 != '\x04') {
LAB_00160197:
        pxVar16 = (xpath_string *)0x16ad89;
        goto LAB_0016019e;
      }
      bVar5 = eval_boolean(this,c,stack);
      pxVar16 = (xpath_string *)CONCAT71(extraout_var,bVar5);
      pcVar23 = "false";
      if (bVar5) {
        pcVar23 = "true";
      }
      __return_storage_ptr__->_buffer = pcVar23;
      goto LAB_001605a2;
    }
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_node_set((xpath_node_set_raw *)local_b0,this,c,(xpath_stack *)local_68,nodeset_eval_first);
    if ((xpath_node *)CONCAT71(local_b0._9_7_,local_b0[8]) != local_a0) {
      xVar36 = xpath_first((xpath_node *)CONCAT71(local_b0._9_7_,local_b0[8]),local_a0,
                           local_b0._0_4_);
      string_value(__return_storage_ptr__,(anon_unknown_0 *)xVar36._node._root._root,
                   (xpath_node *)xVar36._attribute._attr._attr,stack->result);
      goto LAB_00160585;
    }
LAB_0016056e:
    pcVar23 = "";
LAB_00160575:
    __return_storage_ptr__->_buffer = pcVar23;
    break;
  case '\x19':
    pxVar9 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar9 == (xml_node_struct *)0x0) &&
       (pxVar9 = (c->n)._node._root, pxVar9 == (xml_node_struct *)0x0)) {
      pxVar26 = (xpath_string *)0x16ad89;
    }
    else {
      pxVar26 = (xpath_string *)0x16ad89;
      if ((xpath_string *)pxVar9->name != (xpath_string *)0x0) {
        pxVar26 = (xpath_string *)pxVar9->name;
      }
    }
    pxVar16 = (xpath_string *)strchr((char *)pxVar26,0x3a);
    pxVar19 = (xpath_string *)((long)&pxVar16->_buffer + 1);
    if (pxVar16 == (xpath_string *)0x0) {
      pxVar19 = pxVar26;
    }
LAB_0016059f:
    __return_storage_ptr__->_buffer = (char_t *)pxVar19;
    goto LAB_001605a2;
  case '\x1a':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_b0,this->_left,c,stack,nodeset_eval_first);
    xVar36 = xpath_first((xpath_node *)CONCAT71(local_b0._9_7_,local_b0[8]),local_a0,local_b0._0_4_)
    ;
    xVar22._attr = xVar36._attribute._attr._attr;
    if ((xVar36._attribute._attr._attr == (xml_attribute_struct *)0x0) &&
       (xVar22._attr = (xml_attribute_struct *)xVar36._node._root._root,
       xVar36._node._root._root == (xml_node_struct *)0x0)) {
      pcVar23 = "";
    }
    else {
      pcVar23 = "";
      if (((xml_node_struct *)xVar22._attr)->name != (char *)0x0) {
        pcVar23 = ((xml_node_struct *)xVar22._attr)->name;
      }
    }
    pcVar6 = strchr(pcVar23,0x3a);
    pcVar29 = pcVar6 + 1;
    if (pcVar6 == (char *)0x0) {
      pcVar29 = pcVar23;
    }
    __return_storage_ptr__->_buffer = pcVar29;
    break;
  case '\x1b':
    local_d8._target = (xpath_allocator *)(c->n)._node._root;
    local_d8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    pxVar16 = (xpath_string *)namespace_uri((xpath_node *)&local_d8);
    goto LAB_0016019e;
  case '\x1c':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_b0,this->_left,c,stack,nodeset_eval_first);
    local_68 = (undefined1  [16])
               xpath_first((xpath_node *)CONCAT71(local_b0._9_7_,local_b0[8]),local_a0,
                           local_b0._0_4_);
    pcVar23 = namespace_uri((xpath_node *)local_68);
    goto LAB_00160575;
  case '\x1d':
    pxVar9 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar9 == (xml_node_struct *)0x0) &&
       (pxVar9 = (c->n)._node._root, pxVar9 == (xml_node_struct *)0x0)) goto LAB_00160197;
    pxVar16 = (xpath_string *)0x16ad89;
    if ((xpath_string *)pxVar9->name != (xpath_string *)0x0) {
      pxVar16 = (xpath_string *)pxVar9->name;
    }
    goto LAB_0016019e;
  case '\x1e':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_b0,this->_left,c,stack,nodeset_eval_first);
    xVar36 = xpath_first((xpath_node *)CONCAT71(local_b0._9_7_,local_b0[8]),local_a0,local_b0._0_4_)
    ;
    xVar22._attr = xVar36._attribute._attr._attr;
    if ((xVar36._attribute._attr._attr != (xml_attribute_struct *)0x0) ||
       (xVar22._attr = (xml_attribute_struct *)xVar36._node._root._root,
       xVar36._node._root._root != (xml_node_struct *)0x0)) {
      pcVar23 = "";
      if (((xml_node_struct *)xVar22._attr)->name != (char *)0x0) {
        pcVar23 = ((xml_node_struct *)xVar22._attr)->name;
      }
      goto LAB_00160575;
    }
    goto LAB_0016056e;
  case '\x1f':
    pxVar16 = string_value(__return_storage_ptr__,(anon_unknown_0 *)(c->n)._node._root,
                           (xpath_node *)(c->n)._attribute._attr,stack->result);
    return pxVar16;
  case ' ':
    goto switchD_0015fa3c_caseD_20;
  case '!':
    local_d8._target = stack->temp;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    lVar30 = 1;
    for (pxVar10 = this->_right; pxVar10 != (xpath_ast_node *)0x0; pxVar10 = pxVar10->_next) {
      lVar30 = lVar30 + 1;
    }
    local_90 = (xml_node_struct *)__return_storage_ptr__;
    local_88 = (xpath_memory_block *)stack;
    puVar11 = (undefined8 *)xpath_allocator::allocate(local_d8._target,lVar30 * 0x18);
    if (puVar11 == (undefined8 *)0x0) {
      local_90->header = (uintptr_t)(xpath_memory_block *)0x16ad89;
      *(bool *)&local_90->name = false;
      local_90->value = (bool *)0x0;
    }
    else {
      uVar1 = local_88->next;
      uVar2 = local_88->capacity;
      local_68._8_4_ = (int)uVar1;
      local_68._0_8_ = uVar2;
      local_68._12_4_ = (int)((ulong)uVar1 >> 0x20);
      eval_string((xpath_string *)local_b0,this->_left,c,(xpath_stack *)local_68);
      puVar11[2] = local_a0;
      *puVar11 = CONCAT44(local_b0._4_4_,local_b0._0_4_);
      puVar11[1] = CONCAT71(local_b0._9_7_,local_b0[8]);
      pxVar10 = this->_right;
      local_48 = puVar11;
      if (pxVar10 != (xpath_ast_node *)0x0) {
        do {
          eval_string((xpath_string *)local_b0,pxVar10,c,(xpath_stack *)local_68);
          puVar11[5] = local_a0;
          puVar11[3] = CONCAT44(local_b0._4_4_,local_b0._0_4_);
          puVar11[4] = CONCAT71(local_b0._9_7_,local_b0[8]);
          pxVar10 = pxVar10->_next;
          puVar11 = puVar11 + 3;
        } while (pxVar10 != (xpath_ast_node *)0x0);
      }
      puVar11 = local_48;
      if (lVar30 == 0) {
        sVar18 = 1;
      }
      else {
        psVar24 = local_48 + 2;
        lVar32 = 0;
        lVar28 = lVar30;
        do {
          if ((char)psVar24[-1] == '\x01') {
            sVar12 = *psVar24;
          }
          else {
            sVar12 = strlen((char *)psVar24[-2]);
          }
          lVar32 = lVar32 + sVar12;
          psVar24 = psVar24 + 3;
          lVar28 = lVar28 + -1;
        } while (lVar28 != 0);
        sVar18 = lVar32 + 1;
      }
      pxVar13 = (xpath_memory_block *)
                xpath_allocator::allocate((xpath_allocator *)local_88->next,sVar18);
      if (pxVar13 == (xpath_memory_block *)0x0) {
        pxVar13 = (xpath_memory_block *)0x16ad89;
        bVar5 = false;
        pbVar25 = (bool *)0x0;
      }
      else {
        pxVar20 = pxVar13;
        if (lVar30 != 0) {
          lVar28 = 0;
          do {
            pcVar23 = (char *)puVar11[lVar28 * 3];
            cVar4 = *pcVar23;
            while (cVar4 != '\0') {
              pcVar23 = pcVar23 + 1;
              *(char *)&pxVar20->next = cVar4;
              pxVar20 = (xpath_memory_block *)((long)&pxVar20->next + 1);
              cVar4 = *pcVar23;
            }
            lVar28 = lVar28 + 1;
          } while (lVar28 != lVar30);
        }
        *(undefined1 *)&pxVar20->next = 0;
        pbVar25 = (bool *)((long)pxVar20 - (long)pxVar13);
        bVar5 = true;
      }
      local_90->header = (uintptr_t)pxVar13;
      *(bool *)&local_90->name = bVar5;
      local_90->value = pbVar25;
    }
    goto LAB_00160585;
  case '$':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_80._8_8_ = stack->result;
    local_80._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_b0,this->_left,c,(xpath_stack *)local_80);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)local_80);
    pcVar23 = (char *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
    pcVar6 = strstr(pcVar23,(char *)local_68._0_8_);
    pcVar29 = "";
    if (pcVar23 == pcVar6 || pcVar6 == (char *)0x0) {
LAB_00160182:
      bVar5 = false;
      sVar18 = 0;
    }
    else {
      sVar18 = (long)pcVar6 - (long)pcVar23;
      pcVar6 = (char *)xpath_allocator::allocate(stack->result,sVar18 + 1);
      if (pcVar6 == (char *)0x0) goto LAB_00160182;
      memcpy(pcVar6,pcVar23,sVar18);
      pcVar6[sVar18] = '\0';
      bVar5 = true;
      pcVar29 = pcVar6;
    }
    __return_storage_ptr__->_buffer = pcVar29;
    __return_storage_ptr__->_uses_heap = bVar5;
    __return_storage_ptr__->_length_heap = sVar18;
    goto LAB_00160585;
  case '%':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_80._8_8_ = stack->result;
    local_80._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_b0,this->_left,c,(xpath_stack *)local_80);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)local_80);
    uVar3 = local_68._0_8_;
    pcVar23 = strstr((char *)CONCAT44(local_b0._4_4_,local_b0._0_4_),(char *)local_68._0_8_);
    if (pcVar23 == (char *)0x0) {
      pcVar23 = "";
    }
    else {
      if (local_68[8] != true) {
        local_58 = strlen((char *)uVar3);
      }
      pcVar23 = pcVar23 + local_58;
      if (local_b0[8] == true) {
        xpath_string::from_heap
                  (__return_storage_ptr__,pcVar23,
                   (char *)CONCAT44(local_b0._4_4_,local_b0._0_4_) + (long)local_a0,stack->result);
        goto LAB_00160585;
      }
    }
    __return_storage_ptr__->_buffer = pcVar23;
    break;
  case '&':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_b0,this->_left,c,(xpath_stack *)local_68);
    pxVar14 = local_a0;
    if (local_b0[8] != true) {
      pxVar14 = (xpath_node *)strlen((char *)CONCAT44(local_b0._4_4_,local_b0._0_4_));
    }
    dVar33 = eval_number(this->_right,c,stack);
    local_80._0_8_ = floor(dVar33 + 0.5);
    pcVar23 = "";
    puVar31 = (undefined1 *)((long)&(pxVar14->_node)._root + 1);
    auVar34._8_4_ = (int)((ulong)puVar31 >> 0x20);
    auVar34._0_8_ = puVar31;
    auVar34._12_4_ = 0x45300000;
    if ((double)local_80._0_8_ <
        (auVar34._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)puVar31) - 4503599627370496.0)) {
      pxVar9 = (xml_node_struct *)0x3ff0000000000000;
      if (1.0 <= (double)local_80._0_8_) {
        pxVar9 = (xml_node_struct *)local_80._0_8_;
      }
      pcVar23 = (char *)(((long)((double)pxVar9 - 9.223372036854776e+18) &
                          (long)(double)pxVar9 >> 0x3f | (long)(double)pxVar9) +
                         CONCAT44(local_b0._4_4_,local_b0._0_4_) + -1);
      if (local_b0[8] != true) goto LAB_001603d6;
      xpath_string::from_heap
                (__return_storage_ptr__,pcVar23,
                 (char_t *)
                 ((long)&(local_a0->_node)._root + CONCAT44(local_b0._4_4_,local_b0._0_4_)),
                 stack->result);
      goto LAB_00160585;
    }
    goto LAB_001603d6;
  case '\'':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_b0,this->_left,c,(xpath_stack *)local_68);
    pxVar14 = local_a0;
    if (local_b0[8] != true) {
      pxVar14 = (xpath_node *)strlen((char *)CONCAT44(local_b0._4_4_,local_b0._0_4_));
    }
    dVar33 = eval_number(this->_right,c,stack);
    local_90 = (xml_node_struct *)floor(dVar33 + 0.5);
    dVar33 = eval_number(this->_right->_next,c,stack);
    dVar33 = floor(dVar33 + 0.5);
    local_80._0_8_ = local_90;
    pcVar23 = "";
    if ((!NAN((double)local_90)) &&
       (local_80._0_8_ = dVar33 + (double)local_90, !NAN((double)local_80._0_8_))) {
      puVar31 = (undefined1 *)((long)&(pxVar14->_node)._root + 1);
      auVar35._8_4_ = (int)((ulong)puVar31 >> 0x20);
      auVar35._0_8_ = puVar31;
      auVar35._12_4_ = 0x45300000;
      dVar33 = (auVar35._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)puVar31) - 4503599627370496.0);
      if (((double)local_90 < dVar33) &&
         (((double)local_90 < (double)local_80._0_8_ && (1.0 <= (double)local_80._0_8_)))) {
        pxVar9 = (xml_node_struct *)0x3ff0000000000000;
        if (1.0 <= (double)local_90) {
          pxVar9 = local_90;
        }
        puVar15 = (undefined1 *)
                  ((long)(double)local_80._0_8_ >> 0x3f &
                   (long)((double)local_80._0_8_ - 9.223372036854776e+18) |
                  (long)(double)local_80._0_8_);
        if (dVar33 <= (double)local_80._0_8_) {
          puVar15 = puVar31;
        }
        pcVar23 = (char *)(CONCAT44(local_b0._4_4_,local_b0._0_4_) +
                           ((long)((double)pxVar9 - 9.223372036854776e+18) &
                            (long)(double)pxVar9 >> 0x3f | (long)(double)pxVar9) + -1);
        if ((puVar15 != puVar31) || (local_b0[8] == true)) {
          xpath_string::from_heap
                    (__return_storage_ptr__,pcVar23,
                     puVar15 + CONCAT44(local_b0._4_4_,local_b0._0_4_) + -1,stack->result);
          goto LAB_00160585;
        }
      }
    }
LAB_001603d6:
    __return_storage_ptr__->_buffer = pcVar23;
    break;
  case '*':
    string_value((xpath_string *)&local_d8,(anon_unknown_0 *)(c->n)._node._root,
                 (xpath_node *)(c->n)._attribute._attr,stack->result);
    goto LAB_0015fe13;
  case '+':
    eval_string((xpath_string *)&local_d8,this->_left,c,stack);
LAB_0015fe13:
    pcVar7 = xpath_string::data((xpath_string *)&local_d8,stack->result);
    bVar5 = pcVar7 == (char_t *)0x0;
    if (bVar5) {
      pcVar7 = "";
      pxVar16 = (xpath_string *)0x0;
    }
    else {
      pcVar8 = normalize_space(pcVar7);
      pxVar16 = (xpath_string *)(pcVar8 + -(long)pcVar7);
    }
    __return_storage_ptr__->_buffer = pcVar7;
    __return_storage_ptr__->_uses_heap = !bVar5;
    __return_storage_ptr__->_length_heap = (size_t)pxVar16;
    return pxVar16;
  case ',':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_40.temp = stack->result;
    local_40.result = local_d8._target;
    eval_string((xpath_string *)local_b0,this->_left,c,stack);
    eval_string((xpath_string *)local_68,this->_right,c,&local_40);
    eval_string((xpath_string *)local_80,this->_right->_next,c,&local_40);
    pxVar13 = (xpath_memory_block *)xpath_string::data((xpath_string *)local_b0,stack->result);
    uVar3 = local_80._0_8_;
    if (pxVar13 == (xpath_memory_block *)0x0) {
      pxVar13 = (xpath_memory_block *)0x16ad89;
      bVar5 = false;
      pbVar25 = (bool *)0x0;
      goto LAB_00160561;
    }
    __s = local_68._0_8_;
    local_90 = (xml_node_struct *)__return_storage_ptr__;
    if (local_80[8] != true) {
      local_70 = strlen((char *)local_80._0_8_);
    }
    cVar4 = *(char *)&pxVar13->next;
    pxVar20 = pxVar13;
    local_88 = pxVar13;
    if (cVar4 != '\0') goto LAB_00160520;
    goto LAB_0016054f;
  case ':':
    eval_string((xpath_string *)&local_d8,this->_left,c,stack);
    pxVar16 = (xpath_string *)xpath_string::data((xpath_string *)&local_d8,stack->result);
    if (pxVar16 == (xpath_string *)0x0) {
      pxVar16 = (xpath_string *)0x16ad89;
      bVar5 = false;
      sVar18 = 0;
    }
    else {
      bVar21 = *(byte *)&pxVar16->_buffer;
      pxVar26 = pxVar16;
      if (bVar21 != 0) {
        pcVar7 = (this->_data).string;
        pxVar27 = pxVar16;
        pxVar19 = pxVar16;
        do {
          pxVar19 = (xpath_string *)((long)&pxVar19->_buffer + 1);
          if ((char)bVar21 < '\0') {
            uVar17 = 1;
          }
          else {
            bVar21 = pcVar7[bVar21];
            uVar17 = (ulong)(-1 < (char)bVar21);
          }
          pxVar26 = (xpath_string *)((long)&pxVar27->_buffer + uVar17);
          *(byte *)&pxVar27->_buffer = bVar21;
          bVar21 = *(byte *)&pxVar19->_buffer;
          pxVar27 = pxVar26;
        } while (bVar21 != 0);
      }
      *(char_t *)&pxVar26->_buffer = '\0';
      sVar18 = (long)pxVar26 - (long)pxVar16;
      bVar5 = true;
    }
    __return_storage_ptr__->_buffer = (char_t *)pxVar16;
    __return_storage_ptr__->_uses_heap = bVar5;
    __return_storage_ptr__->_length_heap = sVar18;
    return pxVar16;
  }
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  goto LAB_00160585;
LAB_00160520:
  pxVar20 = (xpath_memory_block *)((long)&pxVar20->next + 1);
  pcVar23 = strchr((char *)__s,(int)cVar4);
  if (pcVar23 == (char *)0x0) {
LAB_0016053d:
    *(char *)&pxVar13->next = cVar4;
    pxVar13 = (xpath_memory_block *)((long)&pxVar13->next + 1);
  }
  else {
    uVar17 = (long)pcVar23 - __s;
    if (uVar17 < local_70) {
      cVar4 = *(char *)(uVar3 + uVar17);
      goto LAB_0016053d;
    }
  }
  cVar4 = *(char *)&pxVar20->next;
  if (cVar4 == '\0') {
LAB_0016054f:
    *(undefined1 *)&pxVar13->next = 0;
    pbVar25 = (bool *)((long)pxVar13 - (long)local_88);
    bVar5 = true;
    pxVar13 = local_88;
    __return_storage_ptr__ = (xpath_string *)local_90;
LAB_00160561:
    ((xml_node_struct *)__return_storage_ptr__)->header = (uintptr_t)pxVar13;
    *(bool *)&((xml_node_struct *)__return_storage_ptr__)->name = bVar5;
    ((xml_node_struct *)__return_storage_ptr__)->value = pbVar25;
LAB_00160585:
    xpath_allocator_capture::~xpath_allocator_capture(&local_d8);
    return extraout_RAX;
  }
  goto LAB_00160520;
switchD_0015fa3c_caseD_20:
  this = this->_left;
  goto LAB_0015fa24;
switchD_0015fa3c_caseD_12:
  pxVar16 = (xpath_string *)(this->_data).string;
LAB_0016019e:
  __return_storage_ptr__->_buffer = (char_t *)pxVar16;
LAB_001605a2:
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return pxVar16;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= static_cast<double>(s_length + 1) ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_boolean:
				return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

			case xpath_type_number:
				return convert_number_to_string(eval_number(c, stack), stack.result);

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
				return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
			}

			default:
				assert(false && "Wrong expression for return type string"); // unreachable
				return xpath_string();
			}
		}